

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colibri.c
# Opt level: O2

Col_Char1 * Col_Utf8Set(Col_Char1 *data,Col_Char c)

{
  byte bVar1;
  
  bVar1 = (byte)c;
  if (c < 0x80) {
    *data = bVar1;
    return data + 1;
  }
  if (c < 0x800) {
    *data = (byte)(c >> 6) | 0xc0;
    data[1] = bVar1 & 0x3f | 0x80;
    return data + 2;
  }
  if (c < 0xd800 || (c & 0xffffe000) == 0xe000) {
    *data = (byte)(c >> 0xc) | 0xe0;
    data[1] = (byte)(c >> 6) & 0x3f | 0x80;
    data[2] = bVar1 & 0x3f | 0x80;
    return data + 3;
  }
  if (c - 0x10000 < 0x100000) {
    *data = (byte)(c >> 0x12) | 0xf0;
    data[1] = (byte)(c >> 0xc) & 0x3f | 0x80;
    data[2] = (byte)(c >> 6) & 0x3f | 0x80;
    data[3] = bVar1 & 0x3f | 0x80;
    data = data + 4;
  }
  return data;
}

Assistant:

Col_Char1 *
Col_Utf8Set(
    Col_Char1 * data,   /*!< UTF-8 code unit sequence. */
    Col_Char c)         /*!< Character to write. */
{
    if (c <= 0x7F) {
        *data++ = (Col_Char1) c;
    } else if (c <= 0x7FF) {
        *data++ = (Col_Char1) (((c>>6)&0x1F)|0xC0);
        *data++ = (Col_Char1) (( c    &0x3F)|0x80);
    } else if (c <= 0xD7FF || (c >= 0xE000 && c <= 0xFFFF)) {
        *data++ = (Col_Char1) (((c>>12)&0x1F)|0xE0);
        *data++ = (Col_Char1) (((c>> 6)&0x3F)|0x80);
        *data++ = (Col_Char1) (( c     &0x3F)|0x80);
    } else if (c >= 0x10000 && c <= 0x10FFFF) {
        *data++ = (Col_Char1) (((c>>18)&0x1F)|0xF0);
        *data++ = (Col_Char1) (((c>>12)&0x3F)|0x80);
        *data++ = (Col_Char1) (((c>> 6)&0x3F)|0x80);
        *data++ = (Col_Char1) (( c     &0x3F)|0x80);
    }

    return data;
}